

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 float64_to_floatx80_x86_64(float64 a,float_status *status)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  floatx80 fVar10;
  floatx80 fVar11;
  floatx80 fVar12;
  
  uVar3 = 0x8000000000000000;
  if ((status->flush_inputs_to_zero != '\0') &&
     ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0)) {
    a = a & 0x8000000000000000;
    status->float_exception_flags = status->float_exception_flags | 0x40;
  }
  uVar4 = a & 0xfffffffffffff;
  uVar7 = (uint)(a >> 0x20);
  uVar8 = uVar7 >> 0x14 & 0x7ff;
  iVar2 = (int)uVar7 >> 0x1f;
  if (uVar8 == 0) {
    if (uVar4 != 0) {
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar7 = ((uint)lVar1 ^ 0x3f) + 0xf5;
      uVar4 = uVar4 << ((byte)uVar7 & 0x3f);
      uVar8 = 1 - (uVar7 & 0xff);
      goto LAB_004dfe67;
    }
    uVar7 = iVar2 * -0x8000;
    uVar3 = 0;
  }
  else {
    if (uVar8 != 0x7ff) {
LAB_004dfe67:
      fVar11.low = uVar4 << 0xb | 0x8000000000000000;
      fVar11._8_4_ = uVar8 + iVar2 * -0x8000 + 0x3c00;
      fVar11._12_4_ = 0;
      return fVar11;
    }
    if (uVar4 != 0) {
      if ((a & 0x7ffffffffffff) != 0 && (a & 0x7ff8000000000000) == 0x7ff0000000000000) {
        status->float_exception_flags = status->float_exception_flags | 1;
      }
      uVar6 = a << 0xc;
      bVar9 = status->default_nan_mode == '\0';
      uVar4 = 0xc000000000000000;
      if (uVar6 != 0 && bVar9) {
        uVar4 = uVar6 >> 1 | 0x8000000000000000;
      }
      uVar5 = 0xffff;
      if (uVar6 != 0 && bVar9) {
        uVar5 = (ulong)(iVar2 * -0x8000 | 0x7fff);
      }
      fVar10._8_8_ = uVar5;
      fVar10.low = uVar4;
      return fVar10;
    }
    uVar7 = iVar2 * -0x8000 | 0x7fff;
  }
  fVar12._8_4_ = uVar7;
  fVar12.low = uVar3;
  fVar12._12_4_ = 0;
  return fVar12;
}

Assistant:

floatx80 float64_to_floatx80(float64 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig;

    a = float64_squash_input_denormal(a, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return commonNaNToFloatx80(float64ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign,
                            floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    return
        packFloatx80(
            aSign, aExp + 0x3C00, (aSig | UINT64_C(0x0010000000000000)) << 11);

}